

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

void __thiscall merlin::graph::clear(graph *this)

{
  clear_edges(this);
  if ((this->m_vvacant).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      (this->m_vvacant).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    do {
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&(this->m_vvacant).c);
    } while ((this->m_vvacant).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur !=
             (this->m_vvacant).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::vector<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>::
  resize(&this->m_adj,0);
  return;
}

Assistant:

void clear() {
		clear_edges();
		while (!m_vvacant.empty()) m_vvacant.pop();
		m_adj.resize(0);
	}